

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O3

int script_status(uint script_id,uint32_t *param)

{
  int sent;
  uint32_t p [11];
  int local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined8 local_24;
  
  sent = pigpio_command(gPigCommand,0x2d,script_id,0,0);
  if (0 < sent) {
    recvMax(&local_48,0x2c,sent);
    sent = local_48;
    if (param != (uint32_t *)0x0) {
      *(undefined8 *)(param + 8) = local_24;
      *(undefined8 *)(param + 4) = local_34;
      *(undefined8 *)(param + 6) = uStack_2c;
      *(undefined8 *)param = local_44;
      *(undefined8 *)(param + 2) = uStack_3c;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
  return sent;
}

Assistant:

int script_status(unsigned script_id, uint32_t *param)
{
   int status;
   uint32_t p[PI_MAX_SCRIPT_PARAMS+1]; /* space for script status */

   status = pigpio_command(gPigCommand, PI_CMD_PROCP, script_id, 0, 0);

   if (status > 0)
   {
      recvMax(p, sizeof(p), status);
      status = p[0];
      if (param) memcpy(param, p+1, sizeof(p)-4);
   }

   pthread_mutex_unlock(&command_mutex);

   return status;
}